

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::generateStaticMetacall(Generator *this)

{
  int iVar1;
  ArgumentDef *pAVar2;
  FunctionDef *pFVar3;
  PropertyDef *pPVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  QFlags<QtMocConstants::EnumFlags> QVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  undefined8 *puVar15;
  char *pcVar16;
  QByteArray *pQVar17;
  ClassDef *pCVar18;
  _Base_ptr p_Var19;
  ArgumentDef *a_1;
  long lVar20;
  ArgumentDef *pAVar21;
  int propindex;
  _Rb_tree_node_base *p_Var22;
  char *pcVar23;
  long lVar24;
  QByteArray *lhs;
  FILE *pFVar25;
  char *pcVar26;
  undefined8 *puVar27;
  PropertyDef *p;
  PropertyDef *pPVar28;
  byte bVar29;
  byte bVar30;
  int methodindex;
  ulong uVar31;
  bool bVar32;
  int ctorindex;
  _Rb_tree_node_base *p_Var33;
  uint uVar34;
  long in_FS_OFFSET;
  QMultiMap<QByteArray,_int> automaticPropertyMetaTypes;
  QMap<int,_QMultiMap<QByteArray,_int>_> methodsWithAutomaticTypes;
  ClassDef *pCStack_90;
  QArrayDataPointer<FunctionDef> local_78;
  anon_class_8_1_8991fb9c local_60;
  uint usedArgs;
  undefined1 local_50 [16];
  QByteArray *local_40;
  QByteArray *local_38;
  
  local_38 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  pcVar16 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
          pcVar16);
  usedArgs = 0;
  pcVar16 = (this->cdef->super_BaseDef).classname.d.ptr;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = (char *)&QByteArray::_empty;
  }
  pcVar23 = "    auto *_t = reinterpret_cast<%s *>(_o);\n";
  if (this->cdef->hasQObject != false) {
    pcVar23 = "    auto *_t = static_cast<%s *>(_o);\n";
  }
  fprintf((FILE *)this->out,pcVar23,pcVar16);
  pCVar18 = this->cdef;
  local_60.this = this;
  if ((pCVar18->constructorList).d.size != 0) {
    fwrite("    if (_c == QMetaObject::CreateInstance) {\n",0x2d,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    uVar13 = (uint)(this->cdef->constructorList).d.size;
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    for (uVar34 = 0; uVar13 != uVar34; uVar34 = uVar34 + 1) {
      pcVar16 = (this->cdef->super_BaseDef).classname.d.ptr;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (char *)&QByteArray::_empty;
      }
      fprintf((FILE *)this->out,"        case %d: { %s *_r = new %s(",(ulong)uVar34,pcVar16);
      generateStaticMetacall::anon_class_8_1_8991fb9c::operator()(&local_60,uVar34);
      fwrite(");\n",3,1,(FILE *)this->out);
      pcVar16 = "void";
      if ((this->cdef->hasQGadget == false) &&
         (pcVar16 = "QObject", this->cdef->hasQNamespace != false)) {
        pcVar16 = "void";
      }
      fprintf((FILE *)this->out,
              "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",pcVar16);
    }
    fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    fwrite("    if (_c == QMetaObject::ConstructInPlace) {\n",0x2f,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    for (uVar34 = 0; uVar13 != uVar34; uVar34 = uVar34 + 1) {
      pcVar16 = (this->cdef->super_BaseDef).classname.d.ptr;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (char *)&QByteArray::_empty;
      }
      fprintf((FILE *)this->out,"        case %d: { new (_a[0]) %s(",(ulong)uVar34,pcVar16);
      generateStaticMetacall::anon_class_8_1_8991fb9c::operator()(&local_60,uVar34);
      fwrite("); } break;\n",0xc,1,(FILE *)this->out);
    }
    fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    usedArgs = 0xe;
    pCVar18 = this->cdef;
  }
  local_78.d = (Data *)0x0;
  local_78.ptr = (FunctionDef *)0x0;
  local_78.size = 0;
  QList<FunctionDef>::append((QList<FunctionDef> *)&local_78,&pCVar18->signalList);
  QList<FunctionDef>::append((QList<FunctionDef> *)&local_78,&this->cdef->slotList);
  QList<FunctionDef>::append((QList<FunctionDef> *)&local_78,&this->cdef->methodList);
  if ((QByteArray *)local_78.size != (QByteArray *)0x0) {
    uVar13 = usedArgs | 7;
    usedArgs = usedArgs | 7;
    fwrite("    if (_c == QMetaObject::InvokeMetaMethod) {\n",0x2f,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    for (pQVar17 = (QByteArray *)0x0; pFVar3 = local_78.ptr, pQVar17 < (ulong)local_78.size;
        pQVar17 = (QByteArray *)
                  ((long)&(((QBasicAtomicInt *)&(pQVar17->d).d)->_q_value).super___atomic_base<int>.
                          _M_i + 1)) {
      fprintf((FILE *)this->out,"        case %d: ");
      lhs = &pFVar3[(long)pQVar17].normalizedType;
      methodsWithAutomaticTypes.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
            )anon_var_dwarf_3ea78;
      bVar7 = operator!=(lhs,(char **)&methodsWithAutomaticTypes);
      if (bVar7) {
        pFVar25 = (FILE *)this->out;
        noRef((QByteArray *)&methodsWithAutomaticTypes,lhs);
        pCVar18 = pCStack_90;
        if (pCStack_90 == (ClassDef *)0x0) {
          pCVar18 = (ClassDef *)&QByteArray::_empty;
        }
        fprintf(pFVar25,"{ %s _r = ",pCVar18);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
      }
      fwrite("_t->",4,1,(FILE *)this->out);
      if (pFVar3[(long)pQVar17].inPrivateClass.d.size != 0) {
        pcVar16 = pFVar3[(long)pQVar17].inPrivateClass.d.ptr;
        if (pcVar16 == (char *)0x0) {
          pcVar16 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"%s->",pcVar16);
      }
      pcVar16 = pFVar3[(long)pQVar17].name.d.ptr;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (char *)&QByteArray::_empty;
      }
      fprintf((FILE *)this->out,"%s(",pcVar16);
      if (pFVar3[(long)pQVar17].isRawSlot == true) {
        fwrite("QMethodRawArguments{ _a }",0x19,1,(FILE *)this->out);
        usedArgs = uVar13 | 8;
        uVar13 = uVar13 | 8;
      }
      else {
        pAVar2 = pFVar3[(long)pQVar17].arguments.d.ptr;
        uVar34 = uVar13 | 8;
        uVar31 = 1;
        pAVar21 = pAVar2;
        for (lVar20 = pFVar3[(long)pQVar17].arguments.d.size * 0xa8; lVar20 != 0;
            lVar20 = lVar20 + -0xa8) {
          if (pAVar21 != pAVar2) {
            fputc(0x2c,(FILE *)this->out);
          }
          pcVar16 = (pAVar21->typeNameForCast).d.ptr;
          if (pcVar16 == (char *)0x0) {
            pcVar16 = (char *)&QByteArray::_empty;
          }
          fprintf((FILE *)this->out,"(*reinterpret_cast< %s>(_a[%d]))",pcVar16,uVar31);
          pAVar21 = pAVar21 + 1;
          uVar31 = (ulong)((int)uVar31 + 1);
          uVar13 = uVar34;
          usedArgs = uVar34;
        }
        if (pFVar3[(long)pQVar17].isPrivateSignal != false) {
          if (pFVar3[(long)pQVar17].arguments.d.size != 0) {
            fwrite(", ",2,1,(FILE *)this->out);
          }
          fputs("QPrivateSignal()",(FILE *)this->out);
        }
      }
      fwrite(");",2,1,(FILE *)this->out);
      methodsWithAutomaticTypes.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
            )anon_var_dwarf_3ea78;
      bVar7 = operator!=(lhs,(char **)&methodsWithAutomaticTypes);
      if (bVar7) {
        pFVar25 = (FILE *)this->out;
        noRef((QByteArray *)&methodsWithAutomaticTypes,lhs);
        pCVar18 = pCStack_90;
        if (pCStack_90 == (ClassDef *)0x0) {
          pCVar18 = (ClassDef *)&QByteArray::_empty;
        }
        fprintf(pFVar25,
                "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                pCVar18);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
        usedArgs = uVar13 | 8;
        uVar13 = uVar13 | 8;
      }
      fwrite(" break;\n",8,1,(FILE *)this->out);
    }
    fwrite("        default: ;\n",0x13,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    methodsWithAutomaticTypes.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
            )0xaaaaaaaaaaaaaaaa;
    methodsWithAutomaticTypesHelper
              ((Generator *)&methodsWithAutomaticTypes,(QList<FunctionDef> *)this);
    if ((methodsWithAutomaticTypes.d.d.ptr !=
         (totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
          )0x0) && (*(long *)((long)methodsWithAutomaticTypes.d.d.ptr + 0x30) != 0)) {
      fwrite("    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n",0x3d,1,
             (FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      fwrite("        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n",0x4d,1
             ,(FILE *)this->out);
      if (methodsWithAutomaticTypes.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
           )0x0) {
        p_Var12 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var12 = *(_Rb_tree_node_base **)((long)methodsWithAutomaticTypes.d.d.ptr + 0x20);
      }
      p_Var14 = (_Rb_tree_node_base *)((long)methodsWithAutomaticTypes.d.d.ptr + 0x10);
      if (methodsWithAutomaticTypes.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
           )0x0) {
        p_Var14 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var12 != p_Var14; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        fprintf((FILE *)this->out,"        case %d:\n",(ulong)p_Var12[1]._M_color);
        fwrite("            switch (*reinterpret_cast<int*>(_a[1])) {\n",0x36,1,(FILE *)this->out);
        fwrite("            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n",
               0x51,1,(FILE *)this->out);
        p_Var19 = p_Var12[1]._M_parent;
        if (p_Var19 == (_Base_ptr)0x0) {
          p_Var11 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var11 = *(_Rb_tree_node_base **)(p_Var19 + 1);
        }
        p_Var33 = (_Rb_tree_node_base *)&p_Var19->_M_left;
        if (p_Var19 == (_Base_ptr)0x0) {
          p_Var33 = (_Rb_tree_node_base *)0x0;
        }
        while (p_Var22 = p_Var11, p_Var22 != p_Var33) {
          fprintf((FILE *)this->out,"            case %d:\n",(ulong)*(uint *)&p_Var22[1]._M_right);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
          if ((p_Var11 == p_Var33) ||
             (bVar7 = operator!=((QByteArray *)(p_Var11 + 1),(QByteArray *)(p_Var22 + 1)), bVar7)) {
            p_Var19 = p_Var22[1]._M_parent;
            if (p_Var19 == (_Base_ptr)0x0) {
              p_Var19 = (_Base_ptr)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n"
                    ,p_Var19);
          }
        }
        fwrite("            }\n",0xe,1,(FILE *)this->out);
        fwrite("            break;\n",0x13,1,(FILE *)this->out);
      }
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
      usedArgs = usedArgs | 0xe;
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&methodsWithAutomaticTypes.d);
  }
  if ((this->cdef->signalList).d.size != 0) {
    usedArgs = usedArgs | 10;
    fwrite("    if (_c == QMetaObject::IndexOfMethod) {\n",0x2c,1,(FILE *)this->out);
    for (uVar31 = 0; pCVar18 = this->cdef, (long)uVar31 < (long)(int)(pCVar18->signalList).d.size;
        uVar31 = uVar31 + 1) {
      pFVar3 = (pCVar18->signalList).d.ptr;
      if (((pFVar3[uVar31].wasCloned == false) && (pFVar3[uVar31].inPrivateClass.d.size == 0)) &&
         (pFVar3[uVar31].isStatic == false)) {
        pcVar16 = pFVar3[uVar31].type.rawName.d.ptr;
        if (pcVar16 == (char *)0x0) {
          pcVar16 = (char *)&QByteArray::_empty;
        }
        pcVar23 = (pCVar18->super_BaseDef).classname.d.ptr;
        if (pcVar23 == (char *)0x0) {
          pcVar23 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",pcVar16,
                pcVar23);
        pAVar2 = pFVar3[uVar31].arguments.d.ptr;
        pAVar21 = pAVar2;
        for (lVar20 = pFVar3[uVar31].arguments.d.size * 0xa8; lVar20 != 0; lVar20 = lVar20 + -0xa8)
        {
          if (pAVar21 != pAVar2) {
            fwrite(", ",2,1,(FILE *)this->out);
          }
          pFVar25 = (FILE *)this->out;
          local_40 = &pAVar21->rightType;
          local_50[8] = 0x20;
          local_50._0_8_ = pAVar21;
          QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>::
          convertTo<QByteArray>
                    ((QByteArray *)&methodsWithAutomaticTypes,
                     (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&> *
                     )local_50);
          pCVar18 = pCStack_90;
          if (pCStack_90 == (ClassDef *)0x0) {
            pCVar18 = (ClassDef *)&QByteArray::_empty;
          }
          fputs((char *)pCVar18,pFVar25);
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
          pAVar21 = pAVar21 + 1;
        }
        if (pFVar3[uVar31].isPrivateSignal != false) {
          if (pFVar3[uVar31].arguments.d.size != 0) {
            fwrite(", ",2,1,(FILE *)this->out);
          }
          fputs("QPrivateSignal",(FILE *)this->out);
        }
        pcVar16 = "";
        if (pFVar3[uVar31].isConst != false) {
          pcVar16 = " const";
        }
        pcVar23 = (this->cdef->super_BaseDef).classname.d.ptr;
        if (pcVar23 == (char *)0x0) {
          pcVar23 = (char *)&QByteArray::_empty;
        }
        pcVar26 = pFVar3[uVar31].name.d.ptr;
        if (pcVar26 == (char *)0x0) {
          pcVar26 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,")%s>(_a, &%s::%s, %d))\n",pcVar16,pcVar23,pcVar26,
                uVar31 & 0xffffffff);
        fwrite("            return;\n",0x14,1,(FILE *)this->out);
      }
    }
    fwrite("    }\n",6,1,(FILE *)this->out);
  }
  automaticPropertyMetaTypes.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  automaticPropertyMetaTypesHelper((Generator *)&automaticPropertyMetaTypes);
  if ((automaticPropertyMetaTypes.d.d.ptr !=
       (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
        )0x0) && (*(long *)((long)automaticPropertyMetaTypes.d.d.ptr + 0x30) != 0)) {
    fwrite("    if (_c == QMetaObject::RegisterPropertyMetaType) {\n",0x37,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    fwrite("        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n",0x3d,1,(FILE *)this->out
          );
    if (automaticPropertyMetaTypes.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
         )0x0) {
      p_Var12 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var12 = *(_Rb_tree_node_base **)((long)automaticPropertyMetaTypes.d.d.ptr + 0x20);
    }
    p_Var14 = (_Rb_tree_node_base *)((long)automaticPropertyMetaTypes.d.d.ptr + 0x10);
    if (automaticPropertyMetaTypes.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
         )0x0) {
      p_Var14 = (_Rb_tree_node_base *)0x0;
    }
    while (p_Var11 = p_Var12, p_Var11 != p_Var14) {
      fprintf((FILE *)this->out,"        case %d:\n",(ulong)*(uint *)&p_Var11[1]._M_right);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      if ((p_Var12 == p_Var14) ||
         (bVar7 = operator!=((QByteArray *)(p_Var12 + 1),(QByteArray *)(p_Var11 + 1)), bVar7)) {
        p_Var19 = p_Var11[1]._M_parent;
        if (p_Var19 == (_Base_ptr)0x0) {
          p_Var19 = (_Base_ptr)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,
                "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n",
                p_Var19);
      }
    }
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    usedArgs = usedArgs | 0xe;
  }
  lVar20 = (this->cdef->propertyList).d.size;
  if (lVar20 != 0) {
    pPVar4 = (this->cdef->propertyList).d.ptr;
    bVar9 = false;
    bVar32 = false;
    bVar30 = 0;
    bVar7 = false;
    bVar6 = false;
    pPVar28 = pPVar4;
    for (lVar24 = 0; lVar20 * 0x158 - lVar24 != 0; lVar24 = lVar24 + 0x158) {
      bVar8 = true;
      if (((pPVar28->read).d.size != 0) ||
         (lVar5 = *(long *)((long)&(pPVar4->member).d.size + lVar24),
         bVar8 = (bool)(bVar9 | lVar5 != 0), bVar9 = bVar8, lVar5 != 0)) {
        bVar32 = (bool)(bVar32 | *(int *)((long)&pPVar4->gspec + lVar24) - 3U < 0xfffffffe);
        bVar9 = bVar8;
      }
      bVar29 = 1;
      if ((pPVar28->write).d.size == 0) {
        if (*(long *)((long)&(pPVar4->member).d.size + lVar24) == 0) {
          bVar29 = 0;
        }
        else {
          bVar29 = (&pPVar4->constant)[lVar24] ^ 1;
        }
      }
      bVar30 = bVar30 & 1 | bVar29;
      bVar7 = (bool)(bVar7 | (pPVar28->reset).d.size != 0);
      bVar6 = (bool)(bVar6 | (pPVar28->bind).d.size != 0);
      pPVar28 = pPVar28 + 1;
    }
    if (((bVar9 || (bVar30 & 1) != 0) || bVar6) || bVar7) {
      usedArgs = usedArgs | 7;
    }
    if ((bVar9 || (bVar30 & 1) != 0) || bVar6) {
      usedArgs = usedArgs | 8;
    }
    if (bVar9) {
      fwrite("    if (_c == QMetaObject::ReadProperty) {\n",0x2b,1,(FILE *)this->out);
      if (bVar32) {
        fwrite("        void *_v = _a[0];\n",0x1a,1,(FILE *)this->out);
      }
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      lVar20 = 0x120;
      uVar31 = 0;
      while( true ) {
        if ((long)(int)(this->cdef->propertyList).d.size <= (long)uVar31) break;
        pPVar4 = (this->cdef->propertyList).d.ptr;
        if ((*(long *)((long)pPVar4 + lVar20 + -200) != 0) ||
           (*(long *)((long)pPVar4 + lVar20 + -0xe0) != 0)) {
          methodsWithAutomaticTypes.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
                  )0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&methodsWithAutomaticTypes,"_t->",-1);
          if (*(long *)((long)&(pPVar4->name).d.size + lVar20) != 0) {
            local_50._0_8_ = (long)&(pPVar4->name).d.d + lVar20;
            local_50._8_8_ = "->";
            operator+=((QByteArray *)&methodsWithAutomaticTypes,
                       (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50);
          }
          iVar1 = *(int *)((long)&(pPVar4->type).d.d + lVar20 + 4);
          if (iVar1 == 1) {
            pFVar25 = (FILE *)this->out;
            puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xd0);
            if (puVar27 == (undefined8 *)0x0) {
              puVar27 = &QByteArray::_empty;
            }
            pcVar16 = 
            "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n"
            ;
LAB_0010a8bc:
            fprintf(pFVar25,pcVar16,uVar31 & 0xffffffff,0xaaaaaaaaaaaaaaaa,puVar27);
          }
          else {
            if (iVar1 == 2) {
              pFVar25 = (FILE *)this->out;
              puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xd0);
              if (puVar27 == (undefined8 *)0x0) {
                puVar27 = &QByteArray::_empty;
              }
              pcVar16 = 
              "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n"
              ;
              goto LAB_0010a8bc;
            }
            local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
            QVar10 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::value
                               (&(this->cdef->super_BaseDef).enumDeclarations,
                                (QByteArray *)((long)pPVar4 + lVar20 + -0x108),
                                (QFlags<QtMocConstants::EnumFlags> *)local_50);
            if (((uint)QVar10.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                       super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 1) == 0) {
              local_50._0_8_ = "default";
              bVar9 = operator==((QByteArray *)((long)pPVar4 + lVar20 + -0xd8),(char **)local_50);
              if (bVar9) {
                pFVar25 = (FILE *)this->out;
                pcVar16 = cxxTypeTag((QFlagsStorageHelper<TypeTag,_4>)
                                     ((QFlagsStorageHelper<TypeTag,_4> *)
                                     ((long)&(pPVar4->type).d.ptr + lVar20 + 4))->
                                     super_QFlagsStorage<TypeTag>);
                puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x100);
                if (puVar27 == (undefined8 *)0x0) {
                  puVar27 = &QByteArray::_empty;
                }
                puVar15 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
                pcVar23 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n"
                ;
                goto LAB_0010a9ad;
              }
              lVar24 = *(long *)((long)pPVar4 + lVar20 + -200);
              pFVar25 = (FILE *)this->out;
              pcVar16 = cxxTypeTag((QFlagsStorageHelper<TypeTag,_4>)
                                   ((QFlagsStorageHelper<TypeTag,_4> *)
                                   ((long)&(pPVar4->type).d.ptr + lVar20 + 4))->
                                   super_QFlagsStorage<TypeTag>);
              puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x100);
              if (puVar27 == (undefined8 *)0x0) {
                puVar27 = &QByteArray::_empty;
              }
              if (lVar24 == 0) {
                puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xe8);
                if (puVar15 == (undefined8 *)0x0) {
                  puVar15 = &QByteArray::_empty;
                }
                pcVar23 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n";
              }
              else {
                puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xd0);
                if (puVar15 == (undefined8 *)0x0) {
                  puVar15 = &QByteArray::_empty;
                }
                pcVar23 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n";
              }
              fprintf(pFVar25,pcVar23,uVar31 & 0xffffffff,pcVar16,puVar27,0xaaaaaaaaaaaaaaaa,puVar15
                     );
            }
            else {
              pFVar25 = (FILE *)this->out;
              pcVar16 = *(char **)((long)pPVar4 + lVar20 + -0x100);
              if (pcVar16 == (char *)0x0) {
                pcVar16 = (char *)&QByteArray::_empty;
              }
              puVar27 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
              puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xd0);
              if (puVar15 == (undefined8 *)0x0) {
                puVar15 = &QByteArray::_empty;
              }
              pcVar23 = "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n";
LAB_0010a9ad:
              fprintf(pFVar25,pcVar23,uVar31 & 0xffffffff,pcVar16,puVar27,puVar15);
            }
          }
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
        }
        uVar31 = uVar31 + 1;
        lVar20 = lVar20 + 0x158;
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if ((bVar30 & 1) != 0) {
      fwrite("    if (_c == QMetaObject::WriteProperty) {\n",0x2c,1,(FILE *)this->out);
      fwrite("        void *_v = _a[0];\n",0x1a,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      lVar20 = 0x120;
      uVar31 = 0;
      while( true ) {
        if ((long)(int)(this->cdef->propertyList).d.size <= (long)uVar31) break;
        pPVar4 = (this->cdef->propertyList).d.ptr;
        if ((*(char *)((long)&(pPVar4->type).d.size + lVar20) == '\0') &&
           ((*(long *)((long)pPVar4 + lVar20 + -0xb0) != 0 ||
            (*(long *)((long)pPVar4 + lVar20 + -0xe0) != 0)))) {
          methodsWithAutomaticTypes.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
                  )0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&methodsWithAutomaticTypes,"_t->",-1);
          if (*(long *)((long)&(pPVar4->name).d.size + lVar20) != 0) {
            local_50._0_8_ = (long)&(pPVar4->name).d.d + lVar20;
            local_50._8_8_ = "->";
            operator+=((QByteArray *)&methodsWithAutomaticTypes,
                       (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50);
          }
          local_50._0_8_ = "default";
          bVar9 = operator==((QByteArray *)((long)pPVar4 + lVar20 + -0xc0),(char **)local_50);
          if (bVar9) {
            fprintf((FILE *)this->out,"        case %d: {\n",uVar31 & 0xffffffff);
            pFVar25 = (FILE *)this->out;
            puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xa0);
            if (puVar27 == (undefined8 *)0x0) {
              puVar27 = &QByteArray::_empty;
            }
            pcVar16 = cxxTypeTag((QFlagsStorageHelper<TypeTag,_4>)
                                 ((QFlagsStorageHelper<TypeTag,_4> *)
                                 ((long)&(pPVar4->type).d.ptr + lVar20 + 4))->
                                 super_QFlagsStorage<TypeTag>);
            puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x100);
            if (puVar15 == (undefined8 *)0x0) {
              puVar15 = &QByteArray::_empty;
            }
            fprintf(pFVar25,"            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",
                    0xaaaaaaaaaaaaaaaa,puVar27,pcVar16,puVar15);
            fwrite("            break;\n",0x13,1,(FILE *)this->out);
            fwrite("        }\n",10,1,(FILE *)this->out);
          }
          else {
            pFVar25 = (FILE *)this->out;
            if (*(long *)((long)pPVar4 + lVar20 + -0xb0) == 0) {
              fprintf(pFVar25,"        case %d:",uVar31 & 0xffffffff);
              lVar24 = *(long *)((long)pPVar4 + lVar20 + -8);
              pFVar25 = (FILE *)this->out;
              puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xe8);
              if (puVar27 == (undefined8 *)0x0) {
                puVar27 = &QByteArray::_empty;
              }
              pcVar16 = cxxTypeTag((QFlagsStorageHelper<TypeTag,_4>)
                                   ((QFlagsStorageHelper<TypeTag,_4> *)
                                   ((long)&(pPVar4->type).d.ptr + lVar20 + 4))->
                                   super_QFlagsStorage<TypeTag>);
              if (lVar24 == 0) {
                puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x100);
                if (puVar15 == (undefined8 *)0x0) {
                  puVar15 = &QByteArray::_empty;
                }
                fprintf(pFVar25,
                        " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                        0xaaaaaaaaaaaaaaaa,puVar27,pcVar16,puVar15);
              }
              else {
                puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x100);
                if (puVar15 == (undefined8 *)0x0) {
                  puVar15 = &QByteArray::_empty;
                }
                fprintf(pFVar25,
                        "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n"
                        ,0xaaaaaaaaaaaaaaaa,puVar27,pcVar16,puVar15);
                puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x10);
                if (puVar27 == (undefined8 *)0x0) {
                  puVar27 = &QByteArray::_empty;
                }
                fprintf((FILE *)this->out,"                Q_EMIT _t->%s(",puVar27);
                lVar24 = (long)*(int *)((long)&(pPVar4->type).d.d + lVar20);
                if (((-1 < lVar24) &&
                    (pFVar3 = (this->cdef->signalList).d.ptr, pFVar3[lVar24].arguments.d.size == 1))
                   && (bVar9 = operator==(&(pFVar3[lVar24].arguments.d.ptr)->normalizedType,
                                          (QByteArray *)((long)pPVar4 + lVar20 + -0x108)), bVar9)) {
                  puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xe8);
                  if (puVar27 == (undefined8 *)0x0) {
                    puVar27 = &QByteArray::_empty;
                  }
                  fprintf((FILE *)this->out,"%s%s",0xaaaaaaaaaaaaaaaa,puVar27);
                }
                fwrite(");\n",3,1,(FILE *)this->out);
                fwrite("            break;\n",0x13,1,(FILE *)this->out);
              }
            }
            else {
              puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xb8);
              if (puVar27 == (undefined8 *)0x0) {
                puVar27 = &QByteArray::_empty;
              }
              pcVar16 = cxxTypeTag((QFlagsStorageHelper<TypeTag,_4>)
                                   ((QFlagsStorageHelper<TypeTag,_4> *)
                                   ((long)&(pPVar4->type).d.ptr + lVar20 + 4))->
                                   super_QFlagsStorage<TypeTag>);
              puVar15 = *(undefined8 **)((long)pPVar4 + lVar20 + -0x100);
              if (puVar15 == (undefined8 *)0x0) {
                puVar15 = &QByteArray::_empty;
              }
              fprintf(pFVar25,"        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                      uVar31 & 0xffffffff,0xaaaaaaaaaaaaaaaa,puVar27,pcVar16,puVar15);
            }
          }
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
        }
        uVar31 = uVar31 + 1;
        lVar20 = lVar20 + 0x158;
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar7) {
      fwrite("if (_c == QMetaObject::ResetProperty) {\n",0x28,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      lVar20 = 0x98;
      for (uVar31 = 0; (long)uVar31 < (long)(int)(this->cdef->propertyList).d.size;
          uVar31 = uVar31 + 1) {
        pPVar4 = (this->cdef->propertyList).d.ptr;
        if (*(long *)((long)&(pPVar4->name).d.ptr + lVar20) != 0) {
          methodsWithAutomaticTypes.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
                  )0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&methodsWithAutomaticTypes,"_t->",-1);
          if (*(long *)((long)&(pPVar4->reset).d.ptr + lVar20) != 0) {
            local_50._0_8_ = (long)&(pPVar4->bind).d.size + lVar20;
            local_50._8_8_ = "->";
            operator+=((QByteArray *)&methodsWithAutomaticTypes,
                       (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50);
          }
          puVar27 = *(undefined8 **)((long)&(pPVar4->name).d.d + lVar20);
          if (puVar27 == (undefined8 *)0x0) {
            puVar27 = &QByteArray::_empty;
          }
          fprintf((FILE *)this->out,"        case %d: %s%s(); break;\n",uVar31 & 0xffffffff,
                  0xaaaaaaaaaaaaaaaa,puVar27);
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
        }
        lVar20 = lVar20 + 0x158;
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar6) {
      fwrite("    if (_c == QMetaObject::BindableProperty) {\n",0x2f,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      lVar20 = 0x120;
      for (uVar31 = 0; (long)uVar31 < (long)(int)(this->cdef->propertyList).d.size;
          uVar31 = uVar31 + 1) {
        pPVar4 = (this->cdef->propertyList).d.ptr;
        if (*(long *)((long)pPVar4 + lVar20 + -0x98) != 0) {
          methodsWithAutomaticTypes.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_*>
                  )0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&methodsWithAutomaticTypes,"_t->",-1);
          if (*(long *)((long)&(pPVar4->name).d.size + lVar20) != 0) {
            local_50._0_8_ = (long)&(pPVar4->name).d.d + lVar20;
            local_50._8_8_ = "->";
            operator+=((QByteArray *)&methodsWithAutomaticTypes,
                       (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50);
          }
          puVar27 = *(undefined8 **)((long)pPVar4 + lVar20 + -0xa0);
          if (puVar27 == (undefined8 *)0x0) {
            puVar27 = &QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); break;\n",
                  uVar31 & 0xffffffff,0xaaaaaaaaaaaaaaaa,puVar27);
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)&methodsWithAutomaticTypes);
        }
        lVar20 = lVar20 + 0x158;
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
  }
  methodsWithAutomaticTypes.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
        )&usedArgs;
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)&methodsWithAutomaticTypes,UsedT,"_t");
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)&methodsWithAutomaticTypes,UsedC,"_c");
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)&methodsWithAutomaticTypes,UsedId,"_id");
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)&methodsWithAutomaticTypes,UsedA,"_a");
  fwrite("}\n",2,1,(FILE *)this->out);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&automaticPropertyMetaTypes.d);
  QArrayDataPointer<FunctionDef>::~QArrayDataPointer(&local_78);
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateStaticMetacall()
{
    fprintf(out, "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
            cdef->qualified.constData());

    enum UsedArgs {
        UsedT = 1,
        UsedC = 2,
        UsedId = 4,
        UsedA = 8,
    };
    uint usedArgs = 0;

    if (cdef->hasQObject) {
#ifndef QT_NO_DEBUG
        fprintf(out, "    Q_ASSERT(_o == nullptr || staticMetaObject.cast(_o));\n");
#endif
        fprintf(out, "    auto *_t = static_cast<%s *>(_o);\n", cdef->classname.constData());
    } else {
        fprintf(out, "    auto *_t = reinterpret_cast<%s *>(_o);\n", cdef->classname.constData());
    }

    const auto generateCtorArguments = [&](int ctorindex) {
        const FunctionDef &f = cdef->constructorList.at(ctorindex);
        Q_ASSERT(!f.isPrivateSignal); // That would be a strange ctor indeed
        int offset = 1;

        const auto begin = f.arguments.cbegin();
        const auto end = f.arguments.cend();
        for (auto it = begin; it != end; ++it) {
            const ArgumentDef &a = *it;
            if (it != begin)
                fprintf(out, ",");
            fprintf(out, "(*reinterpret_cast<%s>(_a[%d]))",
                    a.typeNameForCast.constData(), offset++);
        }
    };

    if (!cdef->constructorList.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::CreateInstance) {\n");
        fprintf(out, "        switch (_id) {\n");
        const int ctorend = int(cdef->constructorList.size());
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { %s *_r = new %s(", ctorindex,
                    cdef->classname.constData(), cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, ");\n");
            fprintf(out, "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",
                    (cdef->hasQGadget || cdef->hasQNamespace) ? "void" : "QObject");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        fprintf(out, "    if (_c == QMetaObject::ConstructInPlace) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { new (_a[0]) %s(",
                    ctorindex, cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, "); } break;\n");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    if (!methodList.isEmpty()) {
        usedArgs |= UsedT | UsedC | UsedId;
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int methodindex = 0; methodindex < methodList.size(); ++methodindex) {
            const FunctionDef &f = methodList.at(methodindex);
            Q_ASSERT(!f.normalizedType.isEmpty());
            fprintf(out, "        case %d: ", methodindex);
            if (f.normalizedType != "void")
                fprintf(out, "{ %s _r = ", noRef(f.normalizedType).constData());
            fprintf(out, "_t->");
            if (f.inPrivateClass.size())
                fprintf(out, "%s->", f.inPrivateClass.constData());
            fprintf(out, "%s(", f.name.constData());
            int offset = 1;

            if (f.isRawSlot) {
                fprintf(out, "QMethodRawArguments{ _a }");
                usedArgs |= UsedA;
            } else {
                const auto begin = f.arguments.cbegin();
                const auto end = f.arguments.cend();
                for (auto it = begin; it != end; ++it) {
                    const ArgumentDef &a = *it;
                    if (it != begin)
                        fprintf(out, ",");
                    fprintf(out, "(*reinterpret_cast< %s>(_a[%d]))",a.typeNameForCast.constData(), offset++);
                    usedArgs |= UsedA;
                }
                if (f.isPrivateSignal) {
                    if (!f.arguments.isEmpty())
                        fprintf(out, ", ");
                    fprintf(out, "%s", "QPrivateSignal()");
                }
            }
            fprintf(out, ");");
            if (f.normalizedType != "void") {
                fprintf(out, "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                        noRef(f.normalizedType).constData());
                usedArgs |= UsedA;
            }
            fprintf(out, " break;\n");
        }
        fprintf(out, "        default: ;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");

        QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes = methodsWithAutomaticTypesHelper(methodList);

        if (!methodsWithAutomaticTypes.isEmpty()) {
            fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
            fprintf(out, "        switch (_id) {\n");
            fprintf(out, "        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
            QMap<int, QMultiMap<QByteArray, int> >::const_iterator it = methodsWithAutomaticTypes.constBegin();
            const QMap<int, QMultiMap<QByteArray, int> >::const_iterator end = methodsWithAutomaticTypes.constEnd();
            for ( ; it != end; ++it) {
                fprintf(out, "        case %d:\n", it.key());
                fprintf(out, "            switch (*reinterpret_cast<int*>(_a[1])) {\n");
                fprintf(out, "            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
                auto jt = it->begin();
                const auto jend = it->end();
                while (jt != jend) {
                    fprintf(out, "            case %d:\n", jt.value());
                    const QByteArray &lastKey = jt.key();
                    ++jt;
                    if (jt == jend || jt.key() != lastKey)
                        fprintf(out, "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n", lastKey.constData());
                }
                fprintf(out, "            }\n");
                fprintf(out, "            break;\n");
            }
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
            usedArgs |= UsedC | UsedId | UsedA;
        }

    }
    if (!cdef->signalList.isEmpty()) {
        usedArgs |= UsedC | UsedA;
        fprintf(out, "    if (_c == QMetaObject::IndexOfMethod) {\n");
        for (int methodindex = 0; methodindex < int(cdef->signalList.size()); ++methodindex) {
            const FunctionDef &f = cdef->signalList.at(methodindex);
            if (f.wasCloned || !f.inPrivateClass.isEmpty() || f.isStatic)
                continue;
            fprintf(out, "        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",
                    f.type.rawName.constData() , cdef->classname.constData());

            const auto begin = f.arguments.cbegin();
            const auto end = f.arguments.cend();
            for (auto it = begin; it != end; ++it) {
                const ArgumentDef &a = *it;
                if (it != begin)
                    fprintf(out, ", ");
                fprintf(out, "%s", QByteArray(a.type.name + ' ' + a.rightType).constData());
            }
            if (f.isPrivateSignal) {
                if (!f.arguments.isEmpty())
                    fprintf(out, ", ");
                fprintf(out, "%s", "QPrivateSignal");
            }
            fprintf(out, ")%s>(_a, &%s::%s, %d))\n",
                    f.isConst ? " const" : "",
                    cdef->classname.constData(), f.name.constData(), methodindex);
            fprintf(out, "            return;\n");
        }
        fprintf(out, "    }\n");
    }

    const QMultiMap<QByteArray, int> automaticPropertyMetaTypes = automaticPropertyMetaTypesHelper();

    if (!automaticPropertyMetaTypes.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::RegisterPropertyMetaType) {\n");
        fprintf(out, "        switch (_id) {\n");
        fprintf(out, "        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n");
        auto it = automaticPropertyMetaTypes.begin();
        const auto end = automaticPropertyMetaTypes.end();
        while (it != end) {
            fprintf(out, "        case %d:\n", it.value());
            const QByteArray &lastKey = it.key();
            ++it;
            if (it == end || it.key() != lastKey)
                fprintf(out, "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n", lastKey.constData());
        }
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    if (!cdef->propertyList.empty()) {
        bool needGet = false;
        bool needTempVarForGet = false;
        bool needSet = false;
        bool needReset = false;
        bool hasBindableProperties = false;
        for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
            needGet |= !p.read.isEmpty() || !p.member.isEmpty();
            if (!p.read.isEmpty() || !p.member.isEmpty())
                needTempVarForGet |= (p.gspec != PropertyDef::PointerSpec
                                      && p.gspec != PropertyDef::ReferenceSpec);

            needSet |= !p.write.isEmpty() || (!p.member.isEmpty() && !p.constant);
            needReset |= !p.reset.isEmpty();
            hasBindableProperties |= !p.bind.isEmpty();
        }
        if (needGet || needSet || hasBindableProperties || needReset)
            usedArgs |= UsedT | UsedC | UsedId;
        if (needGet || needSet || hasBindableProperties)
            usedArgs |= UsedA;  // resetting doesn't need arguments

        if (needGet) {
            fprintf(out, "    if (_c == QMetaObject::ReadProperty) {\n");
            if (needTempVarForGet)
                fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.read.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }

                if (p.gspec == PropertyDef::PointerSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
                else if (p.gspec == PropertyDef::ReferenceSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
                else if (auto eflags = cdef->enumDeclarations.value(p.type); eflags & EnumIsFlag)
                    fprintf(out, "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n",
                            propindex, p.type.constData(), prefix.constData(), p.read.constData());
#endif
                else if (p.read == "default")
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.bind.constData());
                else if (!p.read.isEmpty())
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.read.constData());
                else
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.member.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needSet) {
            fprintf(out, "    if (_c == QMetaObject::WriteProperty) {\n");
            fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.constant)
                    continue;
                if (p.write.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                if (p.write == "default") {
                    fprintf(out, "        case %d: {\n", propindex);
                    fprintf(out, "            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",
                            prefix.constData(), p.bind.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    fprintf(out, "            break;\n");
                    fprintf(out, "        }\n");
                } else if (!p.write.isEmpty()) {
                    fprintf(out, "        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                            propindex, prefix.constData(), p.write.constData(),
                            cxxTypeTag(p.typeTag), p.type.constData());
                } else {
                    fprintf(out, "        case %d:", propindex);
                    if (p.notify.isEmpty()) {
                        fprintf(out, " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    } else {
                        fprintf(out, "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                        fprintf(out, "                Q_EMIT _t->%s(", p.notify.constData());
                        if (p.notifyId > -1) {
                            const FunctionDef &f = cdef->signalList.at(p.notifyId);
                            if (f.arguments.size() == 1 && f.arguments.at(0).normalizedType == p.type)
                                fprintf(out, "%s%s", prefix.constData(), p.member.constData());
                        }
                        fprintf(out, ");\n");
                        fprintf(out, "            break;\n");
                    }
                }
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needReset) {
            fprintf(out, "if (_c == QMetaObject::ResetProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.reset.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out, "        case %d: %s%s(); break;\n",
                        propindex, prefix.constData(), p.reset.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (hasBindableProperties) {
            fprintf(out, "    if (_c == QMetaObject::BindableProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.bind.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out,
                        "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); "
                        "break;\n",
                        propindex, prefix.constData(), p.bind.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }
    }

    auto printUnused = [&](UsedArgs entry, const char *name) {
        if ((usedArgs & entry) == 0)
            fprintf(out, "    (void)%s;\n", name);
    };
    printUnused(UsedT, "_t");
    printUnused(UsedC, "_c");
    printUnused(UsedId, "_id");
    printUnused(UsedA, "_a");

    fprintf(out, "}\n");
}